

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix,
          EvalContext *customEvalContext)

{
  SourceRange varRange;
  bool bVar1;
  uint uVar2;
  SourceLocation in_RAX;
  Diagnostic *pDVar4;
  Type *this_00;
  Type *pTVar5;
  SourceLocation SVar6;
  SourceLocation unaff_RBX;
  DiagCode code;
  ValueSymbol *symbol;
  SourceRange sourceRange;
  int iVar3;
  SourceLocation SVar7;
  
  SVar7 = (this->super_Expression).sourceRange.startLoc;
  if (((ulong)location & 0xfffffff) == 0) {
    location = SVar7;
  }
  symbol = this->symbol;
  iVar3 = (symbol->super_Symbol).kind;
  if ((iVar3 - 10U < 0x3f) && ((0x4000000008000001U >> ((ulong)(iVar3 - 10U) & 0x3f) & 1) != 0)) {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x340007,location);
    pDVar4 = Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
    Diagnostic::operator<<(pDVar4,(this->super_Expression).sourceRange);
    return false;
  }
  if (((context->flags).m_bits & 0x80) == 0) {
    if (iVar3 == 0x39) {
      SVar6 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 10;
LAB_003b9b03:
      sourceRange.endLoc = SVar6;
      sourceRange.startLoc = SVar7;
      ASTContext::addDiag(context,code,sourceRange);
      return false;
    }
  }
  else {
    this_00 = DeclaredType::getType(&symbol->declaredType);
    pTVar5 = this_00->canonical;
    if (pTVar5 == (Type *)0x0) {
      Type::resolveCanonical(this_00);
      pTVar5 = this_00->canonical;
    }
    if ((pTVar5->super_Symbol).kind == CHandleType) {
      SVar7 = (this->super_Expression).sourceRange.startLoc;
      SVar6 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 9;
      goto LAB_003b9b03;
    }
    symbol = this->symbol;
    iVar3 = (symbol->super_Symbol).kind;
    in_RAX = (SourceLocation)customEvalContext;
    if (iVar3 == 0x39) {
      if (((byte)((flags.m_bits & 0x10) >> 4) &
          (*(Symbol **)&symbol[1].super_Symbol)[2].kind == FixedSizeUnpackedArrayType) == 1) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x4e0007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        return false;
      }
      goto LAB_003b9ba4;
    }
  }
  uVar2 = iVar3 - 0x2b;
  if (uVar2 < 0x28) {
    if ((0xc006078000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if (((ulong)uVar2 == 0) && (symbol[1].super_Symbol.kind == 0)) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x520007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        Diagnostic::addNote(pDVar4,(DiagCode)0x40001,(this->symbol->super_Symbol).location);
        return false;
      }
    }
    else {
      varRange.endLoc = unaff_RBX;
      varRange.startLoc = in_RAX;
      bVar1 = checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)symbol,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_4_,
                         (this->super_Expression).sourceRange.startLoc,varRange);
      if (!bVar1) {
        return false;
      }
      symbol = this->symbol;
    }
  }
LAB_003b9ba4:
  if (longestStaticPrefix != (Expression *)0x0) {
    this = (ValueExpressionBase *)longestStaticPrefix;
  }
  ASTContext::addDriver(context,symbol,&this->super_Expression,flags,customEvalContext);
  return true;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix,
                                            EvalContext* customEvalContext) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        if (symbol.as<ModportPortSymbol>().direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags, customEvalContext);

    return true;
}